

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  double dVar5;
  bool bVar6;
  short sVar7;
  int iVar8;
  ImGuiWindow *pIVar9;
  ImGuiContext *pIVar10;
  ImGuiWindow *pIVar11;
  undefined1 uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ImGuiWindow *pIVar16;
  ImGuiContext *g;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  ImGuiWindow *pIVar20;
  byte bVar21;
  ImGuiWindow *pIVar22;
  byte bVar23;
  int iVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  
  pIVar10 = GImGui;
  IVar4 = (GImGui->Style).TouchExtraPadding;
  auVar26._8_8_ = 0;
  auVar26._0_4_ = IVar4.x;
  auVar26._4_4_ = IVar4.y;
  auVar26 = maxps(auVar26,_DAT_0019abf0);
  GImGui->WindowsHoverPadding = auVar26._0_8_;
  pIVar11 = pIVar10->MovingWindow;
  pIVar22 = (ImGuiWindow *)0x0;
  if ((pIVar11 != (ImGuiWindow *)0x0) && ((pIVar11->Flags & 0x200) == 0)) {
    pIVar22 = pIVar11;
  }
  lVar14 = (long)(pIVar10->Windows).Size;
  if (lVar14 < 1) {
    pIVar16 = (ImGuiWindow *)0x0;
  }
  else {
    bVar25 = (pIVar10->IO).ConfigWindowsResizeFromEdges;
    uVar15 = lVar14 + 1;
    pIVar16 = (ImGuiWindow *)0x0;
    do {
      pIVar9 = (pIVar10->Windows).Data[uVar15 - 2];
      if (((pIVar9->Active == true) && (pIVar9->Hidden == false)) &&
         (uVar13 = pIVar9->Flags, (uVar13 >> 9 & 1) == 0)) {
        fVar27 = auVar26._0_4_;
        if ((bVar25 & 1U) == 0) {
          fVar27 = IVar4.x;
        }
        if ((uVar13 & 0x1000042) != 0) {
          fVar27 = IVar4.x;
        }
        fVar2 = (pIVar10->IO).MousePos.x;
        if ((pIVar9->OuterRectClipped).Min.x - fVar27 <= fVar2) {
          fVar28 = auVar26._4_4_;
          if ((bVar25 & 1U) == 0) {
            fVar28 = IVar4.y;
          }
          if ((uVar13 & 0x1000042) != 0) {
            fVar28 = IVar4.y;
          }
          fVar3 = (pIVar10->IO).MousePos.y;
          if (((((pIVar9->OuterRectClipped).Min.y - fVar28 <= fVar3) &&
               (fVar2 < fVar27 + (pIVar9->OuterRectClipped).Max.x)) &&
              (fVar3 < fVar28 + (pIVar9->OuterRectClipped).Max.y)) &&
             (((sVar7 = (pIVar9->HitTestHoleSize).x, sVar7 == 0 ||
               (fVar27 = (float)(int)(pIVar9->HitTestHoleOffset).x + (pIVar9->Pos).x, fVar2 < fVar27
               )) || ((fVar27 + (float)(int)sVar7 <= fVar2 ||
                      ((fVar27 = (float)(int)(pIVar9->HitTestHoleOffset).y + (pIVar9->Pos).y,
                       fVar3 < fVar27 || (fVar27 + (float)(int)(pIVar9->HitTestHoleSize).y <= fVar3)
                       ))))))) {
            if (pIVar22 == (ImGuiWindow *)0x0) {
              pIVar22 = pIVar9;
            }
            pIVar20 = pIVar9;
            if (pIVar16 != (ImGuiWindow *)0x0) {
              pIVar20 = pIVar16;
            }
            if (((pIVar11 == (ImGuiWindow *)0x0) || (pIVar16 != (ImGuiWindow *)0x0)) ||
               (pIVar20 = pIVar9, pIVar9->RootWindow != pIVar11->RootWindow)) {
              pIVar16 = pIVar20;
              if (pIVar22 != (ImGuiWindow *)0x0) break;
              pIVar22 = (ImGuiWindow *)0x0;
            }
            else {
              pIVar16 = (ImGuiWindow *)0x0;
            }
          }
        }
      }
      uVar15 = uVar15 - 1;
    } while (1 < uVar15);
  }
  pIVar10->HoveredWindow = pIVar22;
  pIVar10->HoveredWindowUnderMovingWindow = pIVar16;
  pIVar11 = GetTopMostPopupModal();
  bVar25 = false;
  if ((pIVar11 != (ImGuiWindow *)0x0) && (bVar25 = false, pIVar22 != (ImGuiWindow *)0x0)) {
    pIVar16 = pIVar22->RootWindow;
    if (pIVar16->RootWindow == pIVar11) {
      bVar25 = false;
    }
    else {
      do {
        bVar25 = pIVar16 != pIVar11;
        if (pIVar16 == pIVar11) break;
        pIVar16 = pIVar16->ParentWindowInBeginStack;
      } while (pIVar16 != (ImGuiWindow *)0x0);
    }
  }
  uVar13 = (pIVar10->IO).ConfigFlags;
  iVar8 = (pIVar10->OpenPopupStack).Size;
  iVar24 = -1;
  lVar14 = 0;
  bVar18 = 0;
  do {
    if ((pIVar10->IO).MouseClicked[lVar14] == true) {
      (pIVar10->IO).MouseDownOwned[lVar14] = 0 < iVar8 || pIVar22 != (ImGuiWindow *)0x0;
      (pIVar10->IO).MouseDownOwnedUnlessPopupClose[lVar14] =
           pIVar22 != (ImGuiWindow *)0x0 || pIVar11 != (ImGuiWindow *)0x0;
    }
    bVar6 = (pIVar10->IO).MouseDown[lVar14];
    if ((bVar6 == true) &&
       ((iVar24 == -1 ||
        (dVar5 = (pIVar10->IO).MouseClickedTime[iVar24],
        pdVar1 = (pIVar10->IO).MouseClickedTime + lVar14, *pdVar1 <= dVar5 && dVar5 != *pdVar1)))) {
      iVar24 = (int)lVar14;
    }
    bVar18 = bVar18 & 1 | bVar6;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  bVar23 = 1;
  bVar21 = 1;
  bVar19 = 1;
  if (iVar24 != -1) {
    bVar21 = (pIVar10->IO).MouseDownOwned[iVar24];
    bVar19 = (pIVar10->IO).MouseDownOwnedUnlessPopupClose[iVar24];
  }
  bVar17 = (byte)((uVar13 & 0x10) >> 4) | bVar25;
  if (pIVar10->DragDropActive == true) {
    bVar23 = (pIVar10->DragDropSourceFlags & 0x10U) == 0 | bVar17;
  }
  if (bVar21 != 0) {
    bVar23 = bVar17;
  }
  if (bVar23 != 0) {
    pIVar10->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar10->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  if (pIVar10->WantCaptureMouseNextFrame == -1) {
    bVar25 = pIVar22 != (ImGuiWindow *)0x0 || bVar18 != 0;
    (pIVar10->IO).WantCaptureMouse = (bool)(bVar21 & bVar25 | 0 < iVar8);
    bVar25 = (bool)(bVar19 & bVar25 | pIVar11 != (ImGuiWindow *)0x0);
    lVar14 = 0x35d0;
  }
  else {
    bVar25 = pIVar10->WantCaptureMouseNextFrame != 0;
    (pIVar10->IO).WantCaptureMouseUnlessPopupClose = bVar25;
    lVar14 = 0xd0;
  }
  (&pIVar10->Initialized)[lVar14] = bVar25;
  if (pIVar10->WantCaptureKeyboardNextFrame == -1) {
    bVar25 = pIVar10->ActiveId != 0 || pIVar11 != (ImGuiWindow *)0x0;
  }
  else {
    bVar25 = pIVar10->WantCaptureKeyboardNextFrame != 0;
  }
  uVar13 = uVar13 & 9;
  uVar12 = (char)uVar13;
  if (uVar13 != 1) {
    uVar12 = bVar25;
  }
  if ((pIVar10->IO).NavActive == false) {
    uVar12 = bVar25;
  }
  (pIVar10->IO).WantCaptureKeyboard = (bool)uVar12;
  (pIVar10->IO).WantTextInput = pIVar10->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowWithinBeginStackOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}